

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_node.h
# Opt level: O2

bool __thiscall
BufferNode<double,_long>::range_query
          (BufferNode<double,_long> *this,bool type,double lower_bound,double upper_bound,
          vector<std::pair<double,_long>,_std::allocator<std::pair<double,_long>_>_> *answers)

{
  ulong uVar1;
  ulong uVar2;
  undefined7 in_register_00000031;
  ulong uVar3;
  ulong uVar4;
  long local_40;
  double local_38;
  
  Buffer::range_query(&this->buffer,lower_bound,upper_bound,answers);
  if ((int)CONCAT71(in_register_00000031,type) == 0) {
    uVar2 = find_precise_position(this,lower_bound);
    uVar1 = this->size;
    uVar3 = uVar2;
    if (uVar2 <= uVar1) {
      uVar3 = uVar1;
    }
    for (; (uVar4 = uVar3, uVar2 < uVar1 && (uVar4 = uVar2, this->keys[uVar2] < lower_bound));
        uVar2 = uVar2 + 1) {
    }
  }
  else {
    uVar4 = 0;
  }
  for (; (uVar4 < this->size && (local_38 = this->keys[uVar4], local_38 <= upper_bound));
      uVar4 = uVar4 + 1) {
    local_40 = this->payloads[uVar4];
    std::vector<std::pair<double,long>,std::allocator<std::pair<double,long>>>::
    emplace_back<double,long>
              ((vector<std::pair<double,long>,std::allocator<std::pair<double,long>>> *)answers,
               &local_38,&local_40);
  }
  return this->size <= uVar4;
}

Assistant:

bool range_query(bool type, K lower_bound, K upper_bound, std::vector<std::pair<K, P>>& answers) const {
        buffer.range_query(lower_bound, upper_bound, answers);
        size_t it = 0;
        if (!type) {
            it = find_precise_position(lower_bound);
            while (it < size && less_than(get_key(it), lower_bound))
                ++it;
        }
        while (it < size && !greater_than(get_key(it), upper_bound)) {
            answers.emplace_back(get_key(it), get_payload(it));
            ++it;
        }
        if (it < size)
            return false;
        else
            return true;
    }